

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

Tagger * __thiscall MeCab::anon_unknown_0::ModelImpl::createTagger(ModelImpl *this)

{
  int iVar1;
  Tagger *pTVar2;
  
  if ((this->viterbi_ == (Viterbi *)0x0) || ((this->writer_).ptr_ == (Writer *)0x0)) {
    setGlobalError("Model is not available");
    pTVar2 = (Tagger *)0x0;
  }
  else {
    pTVar2 = (Tagger *)operator_new(0x60);
    pTVar2->_vptr_Tagger = (_func_int **)&PTR_parse_0019b7a0;
    pTVar2[2]._vptr_Tagger = (_func_int **)&PTR__scoped_ptr_0019ba88;
    pTVar2[4]._vptr_Tagger = (_func_int **)&PTR__scoped_ptr_0019bac8;
    pTVar2[5]._vptr_Tagger = (_func_int **)0x0;
    pTVar2[8]._vptr_Tagger = (_func_int **)(pTVar2 + 10);
    pTVar2[9]._vptr_Tagger = (_func_int **)0x0;
    *(undefined1 *)&pTVar2[10]._vptr_Tagger = 0;
    pTVar2[3]._vptr_Tagger = (_func_int **)0x0;
    pTVar2[1]._vptr_Tagger = (_func_int **)this;
    iVar1 = this->request_type_;
    pTVar2[7]._vptr_Tagger = (_func_int **)(double)(float)this->theta_;
    *(int *)&pTVar2[6]._vptr_Tagger = iVar1;
  }
  return pTVar2;
}

Assistant:

bool is_available() const {
    return (viterbi_ && writer_.get());
  }